

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

void nn_process_option(nn_parse_context *ctx,int opt_index,char *argument)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined4 uVar4;
  FILE *__stream;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  void *pvVar8;
  nn_parse_context *ctx_00;
  size_t sVar9;
  void *pvVar10;
  nn_option *pnVar11;
  nn_option *pnVar12;
  nn_option *opt;
  long *plVar13;
  long lVar14;
  bool bVar15;
  float fVar16;
  char *endptr;
  char *local_38;
  
  pnVar11 = ctx->options;
  if ((pnVar11[opt_index].conflicts_mask & ctx->mask) != 0) {
    nn_process_option_cold_1();
LAB_00104e48:
    nn_process_option_cold_4();
    goto LAB_00104e51;
  }
  opt = pnVar11 + opt_index;
  ctx->mask = ctx->mask | opt->mask_set;
  pnVar12 = opt;
  ctx_00 = ctx;
  switch(opt->type) {
  case NN_OPT_HELP:
    goto switchD_00104a21_caseD_0;
  case NN_OPT_INT:
    lVar14 = strtol(argument,&stack0xffffffffffffffc8,0);
    *(long *)((long)ctx->target + (long)opt->offset) = lVar14;
    if ((local_38 != argument) && (*local_38 == '\0')) {
      return;
    }
    pcVar7 = "requires integer argument";
    goto LAB_00104b17;
  case NN_OPT_INCREMENT:
    piVar1 = (int *)((long)ctx->target + (long)opt->offset);
    *piVar1 = *piVar1 + 1;
    break;
  case NN_OPT_DECREMENT:
    piVar1 = (int *)((long)ctx->target + (long)opt->offset);
    *piVar1 = *piVar1 + -1;
    break;
  case NN_OPT_ENUM:
    goto switchD_00104a21_caseD_4;
  case NN_OPT_SET_ENUM:
    uVar4 = *opt->pointer;
    pvVar10 = ctx->target;
    iVar3 = opt->offset;
    goto LAB_00104cdc;
  case NN_OPT_STRING:
    *(char **)((long)ctx->target + (long)opt->offset) = argument;
    break;
  case NN_OPT_BLOB:
    pvVar10 = ctx->target;
    lVar14 = (long)opt->offset;
    *(char **)((long)pvVar10 + lVar14) = argument;
    sVar5 = strlen(argument);
    *(int *)((long)pvVar10 + lVar14 + 8) = (int)sVar5;
    *(undefined4 *)((long)pvVar10 + lVar14 + 0xc) = 0;
    break;
  case NN_OPT_FLOAT:
    fVar16 = strtof(argument,&stack0xffffffffffffffc8);
    *(float *)((long)ctx->target + (long)opt->offset) = fVar16;
    if ((local_38 != argument) && (*local_38 == '\0')) {
      return;
    }
    pcVar7 = "requires float point argument";
LAB_00104b17:
    pnVar12 = (nn_option *)&stack0xffffffffffffffc8;
    nn_option_error(pcVar7,ctx,opt_index);
    pnVar11 = opt;
switchD_00104a21_caseD_4:
    pcVar7 = *pnVar12->pointer;
    puVar2 = (undefined8 *)pnVar12->pointer;
    while( true ) {
      if (pcVar7 == (char *)0x0) {
        plVar13 = (long *)pnVar11[opt_index].pointer;
        fprintf(_stderr,"%s: Invalid value ``%s\'\' for",*ctx->argv,argument);
        nn_print_option(ctx,opt_index,(FILE *)_stderr);
        fwrite(". Options are:\n",0xf,1,_stderr);
        lVar14 = *plVar13;
        while (lVar14 != 0) {
          plVar13 = plVar13 + 2;
          fprintf(_stderr,"    %s\n");
          lVar14 = *plVar13;
        }
        exit(1);
      }
      iVar3 = strcmp(pcVar7,argument);
      if (iVar3 == 0) break;
      pcVar7 = (char *)puVar2[2];
      puVar2 = puVar2 + 2;
    }
    uVar4 = *(undefined4 *)(puVar2 + 1);
    pvVar10 = ctx->target;
    iVar3 = pnVar12->offset;
LAB_00104cdc:
    *(undefined4 *)((long)pvVar10 + (long)iVar3) = uVar4;
    break;
  case NN_OPT_LIST_APPEND:
    nn_append_string(ctx,opt,argument);
    return;
  case NN_OPT_LIST_APPEND_FMT:
switchD_00104a21_caseD_a:
    sVar5 = strlen(argument);
    ctx_00 = (nn_parse_context *)opt->pointer;
    sVar6 = strlen((char *)ctx_00);
    sVar6 = sVar6 + sVar5;
    pcVar7 = (char *)malloc(sVar6);
    iVar3 = snprintf(pcVar7,sVar6,(char *)ctx_00,argument);
    if (sVar6 <= (ulong)(long)iVar3) {
LAB_00104e51:
      __assert_fail("data_len < data_buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tools/options.c"
                    ,0x1cc,"void nn_process_option(struct nn_parse_context *, int, char *)");
    }
    nn_append_string(ctx,opt,pcVar7);
    pvVar10 = ctx->target;
    lVar14 = (long)opt->offset;
    if (*(long *)((long)pvVar10 + lVar14 + 8) == 0) {
      pvVar8 = malloc(8);
      *(void **)((long)pvVar10 + lVar14 + 8) = pvVar8;
      *(undefined4 *)((long)pvVar10 + lVar14 + 0x14) = 1;
    }
    else {
      iVar3 = *(int *)((long)pvVar10 + lVar14 + 0x14);
      *(int *)((long)pvVar10 + lVar14 + 0x14) = iVar3 + 1;
      pvVar8 = realloc(*(void **)((long)pvVar10 + lVar14),(long)iVar3 * 8 + 8);
      *(void **)((long)pvVar10 + lVar14 + 8) = pvVar8;
    }
    if (*(long *)((long)pvVar10 + lVar14) != 0) {
      *(char **)(*(long *)((long)pvVar10 + lVar14 + 8) + -8 +
                (long)*(int *)((long)pvVar10 + lVar14 + 0x14) * 8) = pcVar7;
      return;
    }
LAB_00104e79:
    nn_process_option_cold_6();
    goto LAB_00104e81;
  case NN_OPT_READ_FILE:
    iVar3 = strcmp(argument,"-");
    __stream = _stdin;
    if ((iVar3 != 0) && (__stream = fopen(argument,"r"), __stream == (FILE *)0x0)) {
      nn_process_option_cold_2();
      opt = (nn_option *)0x0;
      goto switchD_00104a21_caseD_a;
    }
    sVar5 = 0x1000;
    ctx_00 = (nn_parse_context *)malloc(0x1000);
    if (ctx_00 == (nn_parse_context *)0x0) {
      nn_process_option_cold_5();
      ctx_00 = ctx;
      goto LAB_00104e79;
    }
    sVar6 = fread(ctx_00,1,0x1000,__stream);
    sVar6 = (size_t)(int)sVar6;
    iVar3 = feof(__stream);
    if (iVar3 == 0) {
      sVar5 = 0x1000;
      do {
        if (sVar5 - sVar6 < 0x400) {
          sVar9 = sVar5 * 2;
          bVar15 = sVar5 < 0x100000;
          sVar5 = sVar5 + 0x100000;
          if (bVar15) {
            sVar5 = sVar9;
          }
          ctx_00 = (nn_parse_context *)realloc(ctx_00,sVar5);
          if (ctx_00 == (nn_parse_context *)0x0) goto LAB_00104e48;
        }
        sVar9 = fread((char *)((long)&ctx_00->def + sVar6),1,sVar5 - sVar6,__stream);
        sVar6 = sVar6 + (long)(int)sVar9;
        iVar3 = feof(__stream);
      } while (iVar3 == 0);
    }
    if ((sVar6 != sVar5) &&
       (ctx_00 = (nn_parse_context *)realloc(ctx_00,sVar6), ctx_00 == (nn_parse_context *)0x0)) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tools/options.c"
                    ,499,"void nn_process_option(struct nn_parse_context *, int, char *)");
    }
    iVar3 = ferror(__stream);
    if (iVar3 == 0) {
      if (__stream != _stdin) {
        fclose(__stream);
      }
      pvVar10 = ctx->target;
      lVar14 = (long)opt->offset;
      *(nn_parse_context **)((long)pvVar10 + lVar14) = ctx_00;
      *(int *)((long)pvVar10 + lVar14 + 8) = (int)sVar6;
      *(undefined4 *)((long)pvVar10 + lVar14 + 0xc) = 1;
      return;
    }
LAB_00104e81:
    nn_process_option_cold_3();
switchD_00104a21_caseD_0:
    nn_print_help(ctx_00,_stdout);
    exit(0);
  default:
    abort();
  }
  return;
}

Assistant:

static void nn_process_option (struct nn_parse_context *ctx,
                              int opt_index, char *argument)
{
    struct nn_option *opt;
    struct nn_enum_item *items;
    char *endptr;
    struct nn_blob *blob;
    FILE *file;
    char *data;
    size_t data_len;
    size_t data_buf;
    int bytes_read;

    opt = &ctx->options[opt_index];
    if (ctx->mask & opt->conflicts_mask) {
        nn_option_conflict (ctx, opt_index);
    }
    ctx->mask |= opt->mask_set;

    switch (opt->type) {
        case NN_OPT_HELP:
            nn_print_help (ctx, stdout);
            exit (0);
            return;
        case NN_OPT_INT:
            *(long *)(((char *)ctx->target) + opt->offset) = strtol (argument,
                &endptr, 0);
            if (endptr == argument || *endptr != 0) {
                nn_option_error ("requires integer argument",
                                ctx, opt_index);
            }
            return;
        case NN_OPT_INCREMENT:
            *(int *)(((char *)ctx->target) + opt->offset) += 1;
            return;
        case NN_OPT_DECREMENT:
            *(int *)(((char *)ctx->target) + opt->offset) -= 1;
            return;
        case NN_OPT_ENUM:
            items = (struct nn_enum_item *)opt->pointer;
            for (;items->name; ++items) {
                if (!strcmp (items->name, argument)) {
                    *(int *)(((char *)ctx->target) + opt->offset) = \
                        items->value;
                    return;
                }
            }
            nn_invalid_enum_value (ctx, opt_index, argument);
            return;
        case NN_OPT_SET_ENUM:
            *(int *)(((char *)ctx->target) + opt->offset) = \
                *(int *)(opt->pointer);
            return;
        case NN_OPT_STRING:
            *(char **)(((char *)ctx->target) + opt->offset) = argument;
            return;
        case NN_OPT_BLOB:
            blob = (struct nn_blob *)(((char *)ctx->target) + opt->offset);
            blob->data = argument;
            blob->length = strlen (argument);
            blob->need_free = 0;
            return;
        case NN_OPT_FLOAT:
#if defined NN_HAVE_WINDOWS
            *(float *)(((char *)ctx->target) + opt->offset) =
                (float) atof (argument);
#else
            *(float *)(((char *)ctx->target) + opt->offset) =
                strtof (argument, &endptr);
            if (endptr == argument || *endptr != 0) {
                nn_option_error ("requires float point argument",
                                ctx, opt_index);
            }
#endif
            return;
        case NN_OPT_LIST_APPEND:
            nn_append_string (ctx, opt, argument);
            return;
        case NN_OPT_LIST_APPEND_FMT:
            data_buf = strlen (argument) + strlen (opt->pointer);
            data = malloc (data_buf);
#if defined NN_HAVE_WINDOWS
            data_len = _snprintf_s (data, data_buf, _TRUNCATE, opt->pointer,
                argument);
#else
            data_len = snprintf (data, data_buf, opt->pointer, argument);
#endif
            assert (data_len < data_buf);
            nn_append_string (ctx, opt, data);
            nn_append_string_to_free (ctx, opt, data);
            return;
        case NN_OPT_READ_FILE:
            if (!strcmp (argument, "-")) {
                file = stdin;
            } else {
                file = fopen (argument, "r");
                if (!file) {
                    fprintf (stderr, "Error opening file ``%s'': %s\n",
                        argument, strerror (errno));
                    exit (2);
                }
            }
            data = malloc (4096);
            if (!data)
                nn_memory_error (ctx);
            data_len = 0;
            data_buf = 4096;
            for (;;) {
                bytes_read = fread (data + data_len, 1, data_buf - data_len,
                                   file);
                data_len += bytes_read;
                if (feof (file))
                    break;
                if (data_buf - data_len < 1024) {
                    if (data_buf < (1 << 20)) {
                        data_buf *= 2;  /* grow twice until not too big */
                    } else {
                        data_buf += 1 << 20;  /* grow 1 Mb each time */
                    }
                    data = realloc (data, data_buf);
                    if (!data)
                        nn_memory_error (ctx);
                }
            }
            if (data_len != data_buf) {
                data = realloc (data, data_len);
                assert (data);
            }
            if (ferror (file)) {
#if defined _MSC_VER
#pragma warning (push)
#pragma warning (disable:4996)
#endif
                fprintf (stderr, "Error reading file ``%s'': %s\n",
                    argument, strerror (errno));
#if defined _MSC_VER
#pragma warning (pop)
#endif
                exit (2);
            }
            if (file != stdin) {
                fclose (file);
            }
            blob = (struct nn_blob *)(((char *)ctx->target) + opt->offset);
            blob->data = data;
            blob->length = data_len;
            blob->need_free = 1;
            return;
    }
    abort ();
}